

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::verifyResult
          (GPUConversionDecodeEnabledCase *this)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *this_01;
  reference a;
  MessageBuilder *pMVar2;
  allocator<char> local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  MessageBuilder local_3c0;
  undefined4 local_240;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  MessageBuilder local_218;
  Vector<float,_4> local_98;
  Vector<bool,_4> local_88;
  Vec4 local_84;
  allocator<char> local_71;
  string local_70;
  undefined1 local_40 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixelResultList;
  int resultColorIdx;
  TestLog *log;
  GPUConversionDecodeEnabledCase *this_local;
  
  this_00 = Context::getTestContext((this->super_SRGBTestCase).super_TestCase.m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  pixelResultList.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  SRGBTestCase::readResultTextures(&this->super_SRGBTestCase);
  SRGBTestCase::storeResultPixels
            (&this->super_SRGBTestCase,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Expected color: ",&local_71);
  getColorGreenPass();
  SRGBTestCase::logColor(&this->super_SRGBTestCase,&local_70,0,&local_84);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  a = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40,
                 0);
  getColorGreenPass();
  tcu::equal<float,4>((tcu *)&local_88,a,&local_98);
  bVar1 = tcu::boolAll<4>(&local_88);
  if (bVar1) {
    tcu::TestLog::operator<<(&local_218,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"returned pass color from GPU",&local_239);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_218,&local_238);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    tcu::MessageBuilder::~MessageBuilder(&local_218);
  }
  else {
    tcu::TestLog::operator<<(&local_3c0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"returned fail color from GPU",&local_3e1);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_3c0,&local_3e0);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  }
  local_240 = 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_40);
  return bVar1;
}

Assistant:

bool GPUConversionDecodeEnabledCase::verifyResult (void)
{
	tcu::TestLog&			log				= m_context.getTestContext().getLog();
	const int				resultColorIdx	= 0;
	std::vector<tcu::Vec4>	pixelResultList;

	this->readResultTextures();
	this->storeResultPixels(pixelResultList);
	this->logColor(std::string("Expected color: "), resultColorIdx, getColorGreenPass());

	// result color returned from GPU is either green (pass) or fail (red)
	if ( tcu::boolAll(tcu::equal(pixelResultList[resultColorIdx], getColorGreenPass())) )
	{
		log << tcu::TestLog::Message << std::string("returned pass color from GPU") << tcu::TestLog::EndMessage;
		return true;
	}
	else
	{
		log << tcu::TestLog::Message << std::string("returned fail color from GPU") << tcu::TestLog::EndMessage;
		return false;
	}
}